

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_fd * cram_dopen(hFILE *fp,char *filename,char *mode)

{
  int iVar1;
  cram_fd *fd_00;
  cram_file_def *pcVar2;
  SAM_hdr *pSVar3;
  char *pcVar4;
  refs_t *prVar5;
  cram_metrics *pcVar6;
  char *local_50;
  cram_file_def *def;
  cram_fd *fd;
  char *cp;
  int i;
  char *mode_local;
  char *filename_local;
  hFILE *fp_local;
  
  fd_00 = (cram_fd *)calloc(1,0x8900);
  if (fd_00 == (cram_fd *)0x0) {
    return (cram_fd *)0x0;
  }
  fd_00->level = 5;
  for (cp._4_4_ = 0; mode[cp._4_4_] != '\0'; cp._4_4_ = cp._4_4_ + 1) {
    if (('/' < mode[cp._4_4_]) && (mode[cp._4_4_] < ':')) {
      fd_00->level = mode[cp._4_4_] + -0x30;
      break;
    }
  }
  fd_00->fp = fp;
  fd_00->mode = (int)*mode;
  fd_00->first_container = 0;
  if (fd_00->mode == 0x72) {
    pcVar2 = cram_read_file_def(fd_00);
    fd_00->file_def = pcVar2;
    if (pcVar2 == (cram_file_def *)0x0) goto LAB_0013ab8b;
    fd_00->version =
         (uint)fd_00->file_def->major_version * 0x100 + (uint)fd_00->file_def->minor_version;
    pSVar3 = cram_read_SAM_hdr(fd_00);
    fd_00->header = pSVar3;
    if (pSVar3 == (SAM_hdr *)0x0) goto LAB_0013ab8b;
  }
  else {
    pcVar2 = (cram_file_def *)calloc(1,0x1a);
    if (pcVar2 == (cram_file_def *)0x0) {
      return (cram_fd *)0x0;
    }
    fd_00->file_def = pcVar2;
    builtin_strncpy(pcVar2->magic,"CRAM",4);
    pcVar2->major_version = '\0';
    pcVar2->minor_version = '\0';
    memset(pcVar2->file_id,0,0x14);
    strncpy(pcVar2->file_id,filename,0x14);
    fd_00->version = major_version * 0x100 + minor_version;
  }
  cram_init_tables(fd_00);
  pcVar4 = strrchr(filename,0x2f);
  local_50 = filename;
  if (pcVar4 != (char *)0x0) {
    local_50 = pcVar4 + 1;
  }
  pcVar4 = strdup(local_50);
  fd_00->prefix = pcVar4;
  if (fd_00->prefix != (char *)0x0) {
    fd_00->last_base = -1;
    fd_00->first_base = -1;
    fd_00->record_counter = 0;
    fd_00->ctr = (cram_container *)0x0;
    prVar5 = refs_create();
    fd_00->refs = prVar5;
    if (fd_00->refs != (refs_t *)0x0) {
      fd_00->ref_id = -2;
      fd_00->ref = (char *)0x0;
      fd_00->decode_md = 0;
      fd_00->verbose = 0;
      fd_00->seqs_per_slice = 10000;
      fd_00->slices_per_container = 1;
      fd_00->embed_ref = 0;
      fd_00->no_ref = 0;
      fd_00->ignore_md5 = 0;
      fd_00->use_bz2 = 0;
      fd_00->use_rans = (uint)(2 < fd_00->version >> 8);
      fd_00->use_lzma = 0;
      fd_00->multi_seq = -1;
      fd_00->unsorted = 0;
      fd_00->shared_ref = 0;
      fd_00->index = (cram_index *)0x0;
      fd_00->own_pool = 0;
      fd_00->pool = (t_pool *)0x0;
      fd_00->rqueue = (t_results_queue *)0x0;
      fd_00->job_pending = (void *)0x0;
      fd_00->ooc = 0;
      fd_00->required_fields = 0x7fffffff;
      for (cp._4_4_ = 0; cp._4_4_ < 0x2f; cp._4_4_ = cp._4_4_ + 1) {
        pcVar6 = cram_new_metrics();
        fd_00->m[cp._4_4_] = pcVar6;
      }
      (fd_00->range).refid = -2;
      fd_00->eof = 1;
      fd_00->ref_fn = (char *)0x0;
      fd_00->bl = (spare_bams *)0x0;
      iVar1 = refs_from_header(fd_00->refs,fd_00,fd_00->header);
      if (iVar1 != -1) {
        return fd_00;
      }
    }
  }
LAB_0013ab8b:
  if (fd_00 != (cram_fd *)0x0) {
    free(fd_00);
  }
  return (cram_fd *)0x0;
}

Assistant:

cram_fd *cram_dopen(hFILE *fp, const char *filename, const char *mode) {
    int i;
    char *cp;
    cram_fd *fd = calloc(1, sizeof(*fd));
    if (!fd)
	return NULL;

    fd->level = 5;
    for (i = 0; mode[i]; i++) {
	if (mode[i] >= '0' && mode[i] <= '9') {
	    fd->level = mode[i] - '0';
	    break;
	}
    }

    fd->fp = fp;
    fd->mode = *mode;
    fd->first_container = 0;

    if (fd->mode == 'r') {
	/* Reader */

	if (!(fd->file_def = cram_read_file_def(fd)))
	    goto err;

	fd->version = fd->file_def->major_version * 256 +
	    fd->file_def->minor_version;

	if (!(fd->header = cram_read_SAM_hdr(fd)))
	    goto err;

    } else {
	/* Writer */
	cram_file_def *def = calloc(1, sizeof(*def));
	if (!def)
	    return NULL;

	fd->file_def = def;

	def->magic[0] = 'C';
	def->magic[1] = 'R';
	def->magic[2] = 'A';
	def->magic[3] = 'M';
	def->major_version = 0; // Indicator to write file def later.
	def->minor_version = 0;
	memset(def->file_id, 0, 20);
	strncpy(def->file_id, filename, 20);

	fd->version = major_version * 256 + minor_version;

	/* SAM header written later along with this file_def */
    }

    cram_init_tables(fd);

    fd->prefix = strdup((cp = strrchr(filename, '/')) ? cp+1 : filename);
    if (!fd->prefix)
	goto err;
    fd->first_base = fd->last_base = -1;
    fd->record_counter = 0;

    fd->ctr = NULL;
    fd->refs  = refs_create();
    if (!fd->refs)
	goto err;
    fd->ref_id = -2;
    fd->ref = NULL;

    fd->decode_md = 0;
    fd->verbose = 0;
    fd->seqs_per_slice = SEQS_PER_SLICE;
    fd->slices_per_container = SLICE_PER_CNT;
    fd->embed_ref = 0;
    fd->no_ref = 0;
    fd->ignore_md5 = 0;
    fd->use_bz2 = 0;
    fd->use_rans = (CRAM_MAJOR_VERS(fd->version) >= 3);
    fd->use_lzma = 0;
    fd->multi_seq = -1;
    fd->unsorted   = 0;
    fd->shared_ref = 0;

    fd->index       = NULL;
    fd->own_pool    = 0;
    fd->pool        = NULL;
    fd->rqueue      = NULL;
    fd->job_pending = NULL;
    fd->ooc         = 0;
    fd->required_fields = INT_MAX;

    for (i = 0; i < DS_END; i++)
	fd->m[i] = cram_new_metrics();

    fd->range.refid = -2; // no ref.
    fd->eof = 1;          // See samtools issue #150
    fd->ref_fn = NULL;

    fd->bl = NULL;

    /* Initialise dummy refs from the @SQ headers */
    if (-1 == refs_from_header(fd->refs, fd, fd->header))
	goto err;

    return fd;

 err:
    if (fd)
	free(fd);

    return NULL;
}